

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O1

void count_zero_samples(png_structp png_ptr,png_row_infop row_info,png_bytep data)

{
  byte *pbVar1;
  png_bytep ppVar2;
  byte bVar3;
  png_byte pVar4;
  png_uint_32 pVar5;
  int iVar6;
  int iVar7;
  png_uint_32 pVar8;
  
  if (png_ptr != (png_structp)0x0) {
    bVar3 = row_info->color_type;
    if ((bVar3 == 3) || (bVar3 == 0)) {
      pVar5 = row_info->width;
      if (pVar5 != 0) {
        pVar4 = row_info->bit_depth;
        iVar7 = 0;
        pVar8 = zero_samples;
        do {
          if (pVar4 == '\x01') {
            bVar3 = (byte)iVar7 & 0x1f;
            if (-1 < (char)(*data << bVar3)) {
              pVar8 = pVar8 + 1;
              zero_samples = pVar8;
            }
            iVar6 = iVar7 + 1;
            iVar7 = 0 << bVar3;
            if (iVar6 != 8) {
              iVar7 = iVar6;
            }
            data = data + (iVar6 == 8);
          }
          if (pVar4 == '\x02') {
            iVar6 = iVar7 + 2;
            bVar3 = (byte)iVar6 & 0x1f;
            if (((uint)*data << bVar3 & 0xc0) == 0) {
              pVar8 = pVar8 + 1;
              zero_samples = pVar8;
            }
            iVar7 = 0 << bVar3;
            if (iVar6 != 8) {
              iVar7 = iVar6;
            }
            data = data + (iVar6 == 8);
          }
          if (pVar4 == '\x04') {
            iVar6 = iVar7 + 4;
            bVar3 = (byte)iVar6 & 0x1f;
            if (((uint)*data << bVar3 & 0xf0) == 0) {
              pVar8 = pVar8 + 1;
              zero_samples = pVar8;
            }
            iVar7 = 0 << bVar3;
            if (iVar6 != 8) {
              iVar7 = iVar6;
            }
            data = data + (iVar6 == 8);
          }
          if ((pVar4 == '\b') && (pbVar1 = data + 1, bVar3 = *data, data = pbVar1, bVar3 == 0)) {
            pVar8 = pVar8 + 1;
            zero_samples = pVar8;
          }
          if (pVar4 == '\x10') {
            if (data[1] == 0 && *data == 0) {
              pVar8 = pVar8 + 1;
              zero_samples = pVar8;
            }
            data = data + 2;
          }
          pVar5 = pVar5 - 1;
        } while (pVar5 != 0);
      }
    }
    else {
      iVar7 = (row_info->channels - 1) + (uint)(bVar3 < 4);
      if (row_info->width != 0) {
        pVar8 = 0;
        pVar5 = zero_samples;
        do {
          if (0 < iVar7) {
            iVar6 = iVar7;
            do {
              if ((row_info->bit_depth == '\b') &&
                 (ppVar2 = data + 1, pVar4 = *data, data = ppVar2, pVar4 == '\0')) {
                pVar5 = pVar5 + 1;
                zero_samples = pVar5;
              }
              if (row_info->bit_depth == '\x10') {
                if (data[1] == '\0' && *data == '\0') {
                  pVar5 = pVar5 + 1;
                  zero_samples = pVar5;
                }
                data = data + 2;
              }
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          if (3 < bVar3) {
            data = data + (ulong)(row_info->bit_depth == '\x10') + 1;
          }
          pVar8 = pVar8 + 1;
        } while (pVar8 != row_info->width);
      }
    }
  }
  return;
}

Assistant:

static void PNGCBAPI
count_zero_samples(png_structp png_ptr, png_row_infop row_info, png_bytep data)
{
   png_bytep dp = data;
   if (png_ptr == NULL)
      return;

   /* Contents of row_info:
    *  png_uint_32 width      width of row
    *  png_uint_32 rowbytes   number of bytes in row
    *  png_byte color_type    color type of pixels
    *  png_byte bit_depth     bit depth of samples
    *  png_byte channels      number of channels (1-4)
    *  png_byte pixel_depth   bits per pixel (depth*channels)
    */

   /* Counts the number of zero samples (or zero pixels if color_type is 3 */

   if (row_info->color_type == 0 || row_info->color_type == 3)
   {
      int pos = 0;
      png_uint_32 n, nstop;

      for (n = 0, nstop=row_info->width; n<nstop; n++)
      {
         if (row_info->bit_depth == 1)
         {
            if (((*dp << pos++ ) & 0x80) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 2)
         {
            if (((*dp << (pos+=2)) & 0xc0) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 4)
         {
            if (((*dp << (pos+=4)) & 0xf0) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 8)
            if (*dp++ == 0)
               zero_samples++;

         if (row_info->bit_depth == 16)
         {
            if ((*dp | *(dp+1)) == 0)
               zero_samples++;
            dp+=2;
         }
      }
   }
   else /* Other color types */
   {
      png_uint_32 n, nstop;
      int channel;
      int color_channels = row_info->channels;
      if (row_info->color_type > 3)
         color_channels--;

      for (n = 0, nstop=row_info->width; n<nstop; n++)
      {
         for (channel = 0; channel < color_channels; channel++)
         {
            if (row_info->bit_depth == 8)
               if (*dp++ == 0)
                  zero_samples++;

            if (row_info->bit_depth == 16)
            {
               if ((*dp | *(dp+1)) == 0)
                  zero_samples++;

               dp+=2;
            }
         }
         if (row_info->color_type > 3)
         {
            dp++;
            if (row_info->bit_depth == 16)
               dp++;
         }
      }
   }
}